

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecal.cpp
# Opt level: O1

void icu_63::CECalendar::jdToCE
               (int32_t julianDay,int32_t jdEpochOffset,int32_t *year,int32_t *month,int32_t *day)

{
  int32_t iVar1;
  undefined8 in_RAX;
  int iVar2;
  int iVar3;
  int32_t r4;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = ClockMath::floorDivide((double)(julianDay - jdEpochOffset),0x5b5,&local_24);
  iVar3 = (int)((ulong)((long)local_24 * 0x4c73064f) >> 0x20) - local_24;
  iVar2 = 0x16d;
  if ((long)local_24 != 0x5b4) {
    iVar2 = local_24 % 0x16d;
  }
  *year = local_24 / 0x16d + iVar1 * 4 + ((iVar3 >> 10) - (iVar3 >> 0x1f));
  *month = iVar2 / 0x1e;
  *day = iVar2 % 0x1e + 1;
  return;
}

Assistant:

void
CECalendar::jdToCE(int32_t julianDay, int32_t jdEpochOffset, int32_t& year, int32_t& month, int32_t& day)
{
    int32_t c4; // number of 4 year cycle (1461 days)
    int32_t r4; // remainder of 4 year cycle, always positive

    c4 = ClockMath::floorDivide(julianDay - jdEpochOffset, 1461, r4);

    year = 4 * c4 + (r4/365 - r4/1460); // 4 * <number of 4year cycle> + <years within the last cycle>

    int32_t doy = (r4 == 1460) ? 365 : (r4 % 365); // days in present year

    month = doy / 30;       // 30 -> Coptic/Ethiopic month length up to 12th month
    day = (doy % 30) + 1;   // 1-based days in a month
}